

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::writeFailure(JUnitTestOutput *this,JUnitTestCaseResultNode *node)

{
  char *pcVar1;
  ulong uVar2;
  SimpleString *this_00;
  long in_RSI;
  long *in_RDI;
  SimpleString buf;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [48];
  char local_20 [16];
  long local_10;
  
  local_10 = in_RSI;
  (**(code **)(**(long **)(in_RSI + 0x18) + 0x10))();
  pcVar1 = SimpleString::asCharString((SimpleString *)0x177710);
  uVar2 = (**(code **)(**(long **)(local_10 + 0x18) + 0x28))();
  (**(code **)(**(long **)(local_10 + 0x18) + 0x30))(local_60);
  (**(code **)(*in_RDI + 0x100))(local_50,in_RDI,local_60);
  this_00 = (SimpleString *)SimpleString::asCharString((SimpleString *)0x17777f);
  StringFromFormat(local_20,"<failure message=\"%s:%d: %s\" type=\"AssertionFailedError\">\n",pcVar1
                   ,uVar2 & 0xffffffff,this_00);
  SimpleString::~SimpleString((SimpleString *)0x1777b6);
  SimpleString::~SimpleString((SimpleString *)0x1777c0);
  SimpleString::~SimpleString((SimpleString *)0x1777cd);
  pcVar1 = SimpleString::asCharString((SimpleString *)0x1777da);
  SimpleString::SimpleString(this_00,pcVar1);
  (**(code **)(*in_RDI + 0xd0))(in_RDI,local_70);
  SimpleString::~SimpleString((SimpleString *)0x177812);
  SimpleString::SimpleString(this_00,pcVar1);
  (**(code **)(*in_RDI + 0xd0))(in_RDI,local_80);
  SimpleString::~SimpleString((SimpleString *)0x177847);
  SimpleString::~SimpleString((SimpleString *)0x177854);
  return;
}

Assistant:

void JUnitTestOutput::writeFailure(JUnitTestCaseResultNode* node)
{
    SimpleString buf = StringFromFormat(
            "<failure message=\"%s:%d: %s\" type=\"AssertionFailedError\">\n",
            node->failure_->getFileName().asCharString(),
            (int) node->failure_->getFailureLineNumber(),
            encodeXmlText(node->failure_->getMessage()).asCharString());
    writeToFile(buf.asCharString());
    writeToFile("</failure>\n");
}